

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture2D::generate
          (Texture2D *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  Texture2D *pTVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture2D *this_00;
  Vec4 local_50;
  undefined1 *local_40;
  undefined1 *puStack_38;
  long lVar4;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar4 = CONCAT44(extraout_var,iVar2);
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D(this_00,context,format,type,size->m_data[0],size->m_data[1]);
  pTVar1 = (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
           m_data.ptr;
  if (pTVar1 != this_00) {
    if (pTVar1 != (Texture2D *)0x0) {
      (*pTVar1->_vptr_Texture2D[1])();
      (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data
      .ptr = (Texture2D *)0x0;
    }
    (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr = this_00;
  }
  tcu::Texture2D::allocLevel
            (&((this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr)->
              m_refTexture,0);
  if (generateMipmaps) {
    tcu::Texture2D::allocLevel
              (&((this->m_texture).
                 super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr)->
                m_refTexture,1);
  }
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x141);
  local_40 = &DAT_3f8000003f800000;
  puStack_38 = &DAT_3f8000003f800000;
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 1.0;
  tcu::fillWithGrid((((this->m_texture).
                      super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
                     ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)&local_40,&local_50);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x145);
  (*((this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.
    ptr)->_vptr_Texture2D[2])();
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture2D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x148);
  if (generateMipmaps) {
    (**(code **)(lVar4 + 0x720))
              (((this->m_texture).
                super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr)->
               m_glTexture);
  }
  (**(code **)(lVar4 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture2D::generate(const glu::RenderContext& context, tcu::IVec3 size,
												   glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(context, format, type, size.x(), size.y()));

	m_texture->getRefTexture().allocLevel(0);
	if (generateMipmaps)
	{
		m_texture->getRefTexture().allocLevel(1);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

	if (generateMipmaps)
	{
		gl.generateTextureMipmap(m_texture->getGLTexture());
	}

	gl.activeTexture(GL_TEXTURE0);
}